

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompOpEvalFilterFirst
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  xmlXPathCompExprPtr pxVar1;
  xmlXPathStepOp *pxVar2;
  xmlNodeSetPtr pxVar3;
  bool bVar4;
  int iVar5;
  xmlNodePtr in_RAX;
  xmlXPathObjectPtr pxVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  xmlNodePtr last;
  xmlNodePtr local_38;
  
  iVar5 = 0;
  if (ctxt->error != 0) {
    return 0;
  }
  pxVar1 = ctxt->comp;
  iVar9 = 0;
  iVar10 = 0;
  local_38 = in_RAX;
  if (((((long)op->ch1 != -1) && (lVar7 = (long)op->ch2, iVar10 = iVar9, lVar7 != -1)) &&
      (pxVar2 = pxVar1->steps, pxVar2[op->ch1].op == XPATH_OP_SORT)) &&
     (pxVar2[lVar7].op == XPATH_OP_SORT)) {
    lVar7 = (long)pxVar2[lVar7].ch1;
    iVar8 = 0;
    bVar4 = true;
    iVar9 = 0;
    iVar10 = 0;
    if (((lVar7 != -1) && (iVar9 = iVar5, iVar10 = iVar8, pxVar2[lVar7].op == XPATH_OP_FUNCTION)) &&
       ((pxVar2[lVar7].value5 == (void *)0x0 &&
        ((pxVar2[lVar7].value == 0 && ((xmlChar *)pxVar2[lVar7].value4 != (xmlChar *)0x0)))))) {
      iVar5 = xmlStrEqual((xmlChar *)pxVar2[lVar7].value4,(xmlChar *)"last");
      if (iVar5 == 0) {
        bVar4 = true;
      }
      else {
        local_38 = (xmlNodePtr)0x0;
        iVar10 = xmlXPathCompOpEvalLast(ctxt,pxVar1->steps + op->ch1,&local_38);
        iVar9 = 0;
        if (((((ctxt->error == 0) &&
              (pxVar6 = ctxt->value, iVar9 = iVar10, pxVar6 != (xmlXPathObjectPtr)0x0)) &&
             (pxVar6->type == XPATH_NODESET)) &&
            ((pxVar3 = pxVar6->nodesetval, pxVar3 != (xmlNodeSetPtr)0x0 &&
             (pxVar3->nodeTab != (xmlNodePtr *)0x0)))) && (1 < pxVar3->nodeNr)) {
          xmlXPathNodeSetKeepLast(pxVar3);
          *first = *ctxt->value->nodesetval->nodeTab;
        }
        bVar4 = false;
      }
    }
    if (!bVar4) {
      return iVar9;
    }
  }
  if ((long)op->ch1 != -1) {
    iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    iVar10 = iVar5 + iVar10;
  }
  if (ctxt->error == 0) {
    if (op->ch2 == -1) {
      return iVar10;
    }
    if (ctxt->value == (xmlXPathObjectPtr)0x0) {
      return iVar10;
    }
    if (ctxt->value->type == XPATH_NODESET) {
      pxVar6 = xmlXPathValuePop(ctxt);
      pxVar3 = pxVar6->nodesetval;
      if ((pxVar3 != (xmlNodeSetPtr)0x0) &&
         (xmlXPathNodeSetFilter(ctxt,pxVar3,op->ch2,1,1,1), 0 < pxVar3->nodeNr)) {
        *first = *pxVar3->nodeTab;
      }
      xmlXPathValuePush(ctxt,pxVar6);
      return iVar10;
    }
    xmlXPathErr(ctxt,0xb);
  }
  return 0;
}

Assistant:

static int
xmlXPathCompOpEvalFilterFirst(xmlXPathParserContextPtr ctxt,
			      xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr obj;
    xmlNodeSetPtr set;

    CHECK_ERROR0;
    comp = ctxt->comp;
    /*
    * Optimization for ()[last()] selection i.e. the last elem
    */
    if ((op->ch1 != -1) && (op->ch2 != -1) &&
	(comp->steps[op->ch1].op == XPATH_OP_SORT) &&
	(comp->steps[op->ch2].op == XPATH_OP_SORT)) {
	int f = comp->steps[op->ch2].ch1;

	if ((f != -1) &&
	    (comp->steps[f].op == XPATH_OP_FUNCTION) &&
	    (comp->steps[f].value5 == NULL) &&
	    (comp->steps[f].value == 0) &&
	    (comp->steps[f].value4 != NULL) &&
	    (xmlStrEqual
	    (comp->steps[f].value4, BAD_CAST "last"))) {
	    xmlNodePtr last = NULL;

	    total +=
		xmlXPathCompOpEvalLast(ctxt,
		    &comp->steps[op->ch1],
		    &last);
	    CHECK_ERROR0;
	    /*
	    * The nodeset should be in document order,
	    * Keep only the last value
	    */
	    if ((ctxt->value != NULL) &&
		(ctxt->value->type == XPATH_NODESET) &&
		(ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeTab != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1)) {
                xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
		*first = *(ctxt->value->nodesetval->nodeTab);
	    }
	    return (total);
	}
    }

    if (op->ch1 != -1)
	total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
    CHECK_ERROR0;
    if (op->ch2 == -1)
	return (total);
    if (ctxt->value == NULL)
	return (total);

    /*
     * In case of errors, xmlXPathNodeSetFilter can pop additional nodes from
     * the stack. We have to temporarily remove the nodeset object from the
     * stack to avoid freeing it prematurely.
     */
    CHECK_TYPE0(XPATH_NODESET);
    obj = xmlXPathValuePop(ctxt);
    set = obj->nodesetval;
    if (set != NULL) {
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, 1, 1, 1);
        if (set->nodeNr > 0)
            *first = set->nodeTab[0];
    }
    xmlXPathValuePush(ctxt, obj);

    return (total);
}